

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.cpp
# Opt level: O2

RealType __thiscall OpenMD::NPTf::calcConservedQuantity(NPTf *this)

{
  Thermo *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  SimInfo *this_01;
  RealType RVar6;
  double dVar7;
  RealType RVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pair<double,_double> pVar14;
  SquareMatrix<double,_3> tmp;
  SquareMatrix3<double> local_100;
  RectMatrix<double,_3U,_3U> local_b8;
  RectMatrix<double,_3U,_3U> local_70;
  
  pVar14 = Snapshot::getThermostat
                     ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  (this->super_NPT).thermostat.first = pVar14.first;
  (this->super_NPT).thermostat.second = pVar14.second;
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])(this);
  this_01 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_;
  (this->super_NPT).NkBT =
       (double)this_01->nGlobalIntegrableObjects_ * 8.31451e-07 * (this->super_NPT).targetTemp;
  iVar11 = SimInfo::getNdf(this_01);
  (this->super_NPT).fkBT = (double)iVar11 * 8.31451e-07 * (this->super_NPT).targetTemp;
  this_00 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar6 = Thermo::getTotalEnergy(this_00);
  dVar1 = (this->super_NPT).fkBT;
  dVar2 = (this->super_NPT).tt2;
  dVar9 = (this->super_NPT).thermostat.first;
  dVar10 = (this->super_NPT).thermostat.second;
  SquareMatrix3<double>::transpose(&local_100,&this->eta);
  operator*((SquareMatrix3<double> *)&local_b8,&local_100,&this->eta);
  RectMatrix<double,_3U,_3U>::operator=(&local_70,&local_b8);
  dVar7 = SquareMatrix<double,_3>::trace((SquareMatrix<double,_3> *)&local_70);
  dVar3 = (this->super_NPT).NkBT;
  dVar4 = (this->super_NPT).targetPressure;
  dVar5 = (this->super_NPT).tb2;
  RVar8 = Thermo::getVolume(this_00);
  auVar13._0_8_ = dVar3 * dVar5 * dVar7;
  auVar12._0_8_ = dVar2 * dVar1 * dVar9 * dVar9;
  auVar12._8_8_ = dVar1 * dVar10;
  auVar12 = divpd(auVar12,_DAT_002451a0);
  auVar13._8_8_ = (RVar8 * dVar4) / 163882576.0;
  auVar13 = divpd(auVar13,_DAT_002451a0);
  return auVar13._8_8_ + auVar12._8_8_ + RVar6 + auVar12._0_8_ + auVar13._0_8_;
}

Assistant:

RealType NPTf::calcConservedQuantity() {
    thermostat = snap->getThermostat();
    loadEta();

    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    // fkBT is used because the thermostat operates on more degrees of freedom
    // than the barostat (when there are particles with orientational degrees
    // of freedom).
    fkBT = info_->getNdf() * Constants::kB * targetTemp;

    RealType conservedQuantity;
    RealType totalEnergy;
    RealType thermostat_kinetic;
    RealType thermostat_potential;
    RealType barostat_kinetic;
    RealType barostat_potential;
    RealType trEta;

    totalEnergy = thermo.getTotalEnergy();

    thermostat_kinetic = fkBT * tt2 * thermostat.first * thermostat.first /
                         (2.0 * Constants::energyConvert);

    thermostat_potential = fkBT * thermostat.second / Constants::energyConvert;

    SquareMatrix<RealType, 3> tmp = eta.transpose() * eta;
    trEta                         = tmp.trace();

    barostat_kinetic = NkBT * tb2 * trEta / (2.0 * Constants::energyConvert);

    barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    conservedQuantity = totalEnergy + thermostat_kinetic +
                        thermostat_potential + barostat_kinetic +
                        barostat_potential;

    return conservedQuantity;
  }